

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

void __thiscall Potassco::TheoryData::removeTerm(TheoryData *this,Id_t termId)

{
  Data *pDVar1;
  ulong uVar2;
  DestroyT local_11;
  
  pDVar1 = this->data_;
  if ((termId < (uint)((pDVar1->terms).top >> 3)) &&
     (uVar2 = (ulong)termId, *(long *)((long)(pDVar1->terms).mem.beg_ + uVar2 * 8) != -1)) {
    DestroyT::operator()(&local_11,(TheoryTerm *)(uVar2 * 8 + (long)(pDVar1->terms).mem.beg_));
    *(undefined8 *)((long)(this->data_->terms).mem.beg_ + uVar2 * 8) = 0xffffffffffffffff;
  }
  return;
}

Assistant:

uint32_t TheoryData::numTerms() const {
	return data_->terms.size();
}